

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

bool __thiscall antlr::BaseAST::equalsListPartial(BaseAST *this,RefAST *sub)

{
  int iVar1;
  AST *pAVar2;
  ASTRefCount *in_RSI;
  bool bVar3;
  RefAST sibling;
  AST *in_stack_ffffffffffffff18;
  AST *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2e;
  byte in_stack_ffffffffffffff2f;
  AST *in_stack_ffffffffffffff30;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  ASTRefCount<antlr::AST> local_50;
  ASTRefCount local_48 [12];
  undefined4 local_3c;
  undefined1 local_38 [24];
  ASTRefCount<antlr::AST> local_20 [3];
  byte local_1;
  
  pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar2 != (AST *)0x0) {
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    do {
      pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)local_20);
      bVar3 = false;
      if (pAVar2 != (AST *)0x0) {
        pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
        bVar3 = pAVar2 != (AST *)0x0;
      }
      if (!bVar3) {
        pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)local_20);
        if ((pAVar2 == (AST *)0x0) &&
           (pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI), pAVar2 != (AST *)0x0)) {
          local_1 = 0;
        }
        else {
          local_1 = 1;
        }
        goto LAB_0020641d;
      }
      pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
      ASTRefCount<antlr::AST>::ASTRefCount
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                 (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
      iVar1 = (*pAVar2->_vptr_AST[4])(pAVar2,local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
      if ((((byte)iVar1 ^ 0xff) & 1) != 0) {
        local_1 = 0;
        goto LAB_0020641d;
      }
      pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
      (*pAVar2->_vptr_AST[0xd])(local_48);
      pAVar2 = ASTRefCount::operator_cast_to_AST_(local_48);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
      if (pAVar2 != (AST *)0x0) {
        pAVar2 = ASTRefCount<antlr::AST>::operator->(local_20);
        (*pAVar2->_vptr_AST[0xd])(&local_50);
        pAVar2 = ASTRefCount<antlr::AST>::operator->(&local_50);
        in_stack_ffffffffffffff30 =
             ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
        (*in_stack_ffffffffffffff30->_vptr_AST[0xd])(local_58);
        iVar1 = (*pAVar2->_vptr_AST[6])(pAVar2,local_58);
        in_stack_ffffffffffffff2f = (byte)iVar1;
        in_stack_ffffffffffffff2e = in_stack_ffffffffffffff2f ^ 0xff;
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
        if ((in_stack_ffffffffffffff2e & 1) != 0) goto LAB_00206243;
      }
      in_stack_ffffffffffffff20 = ASTRefCount<antlr::AST>::operator->(local_20);
      (*in_stack_ffffffffffffff20->_vptr_AST[0xe])(local_60);
      ASTRefCount<antlr::AST>::operator=
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
                 (ASTRefCount<antlr::AST> *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      in_stack_ffffffffffffff18 =
           ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
      (*in_stack_ffffffffffffff18->_vptr_AST[0xe])(local_68);
      ASTRefCount<antlr::AST>::operator=
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
                 (ASTRefCount<antlr::AST> *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
    } while( true );
  }
  local_1 = 1;
LAB_0020643b:
  return (bool)(local_1 & 1);
LAB_00206243:
  local_1 = 0;
LAB_0020641d:
  local_3c = 1;
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20);
  goto LAB_0020643b;
}

Assistant:

bool BaseAST::equalsListPartial(RefAST sub) const
{
	// the empty tree is always a subset of any tree.
	if (!sub)
		return true;

	// Otherwise, start walking sibling lists.  First mismatch, return false.
	RefAST sibling=this;
	for (;sibling && sub;
			sibling=sibling->getNextSibling(), sub=sub->getNextSibling()) {
		// as a quick optimization, check roots first.
		if (!sibling->equals(sub))
			return false;
		// if roots match, do partial list match test on children.
		if (sibling->getFirstChild())
			if (!sibling->getFirstChild()->equalsListPartial(sub->getFirstChild()))
				return false;
	}

	if (!sibling && sub)
		// nothing left to match in this tree, but subtree has more
		return false;

	// either both are null or sibling has more, but subtree doesn't
	return true;
}